

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O2

void __thiscall
helics::DependencyInfo::DependencyInfo<helics::TimeState,unsigned_char>
          (DependencyInfo *this,Time start,TimeState *args,uchar *args_1)

{
  TimeData::TimeData(&this->super_TimeData,start,*args,*args_1);
  (this->fedID).gid = -2010000000;
  this->cyclic = false;
  this->connection = INDEPENDENT;
  this->dependent = false;
  this->dependency = false;
  this->forwarding = false;
  this->nonGranting = false;
  this->triggered = false;
  this->updateRequested = false;
  return;
}

Assistant:

explicit DependencyInfo(Time start, Args&&... args):
        TimeData(start, std::forward<Args>(args)...)
    {
    }